

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void kmp_set_library_throughput_(void)

{
  __kmp_user_set_library(library_throughput);
  return;
}

Assistant:

void FTN_STDCALL
FTN_SET_LIBRARY_THROUGHPUT( void )
{
    #ifdef KMP_STUB
        __kmps_set_library( library_throughput );
    #else
        // __kmp_user_set_library initializes the library if needed
        __kmp_user_set_library( library_throughput );
    #endif
}